

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowing(void)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ImGuiNavLayer layer;
  ImGuiInputSource IVar4;
  float fVar5;
  float fVar6;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *new_nav_window;
  float move_speed;
  float NAV_MOVE_SPEED;
  ImVec2 move_delta;
  int focus_change_dir;
  ImGuiWindow *window;
  bool start_windowing_with_keyboard;
  bool start_windowing_with_gamepad;
  ImGuiWindow *modal_window;
  bool apply_toggle_layer;
  ImGuiWindow *apply_focus_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 force_reinit;
  ImGuiWindow *in_stack_ffffffffffffff80;
  bool local_72;
  bool local_71;
  undefined8 in_stack_ffffffffffffff90;
  ImGuiWindow *pIVar7;
  undefined8 in_stack_ffffffffffffff98;
  ImGuiWindow *pIVar8;
  ImVec2 local_5c;
  float local_54;
  undefined4 local_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  int local_34;
  ImGuiWindow *local_30;
  bool local_22;
  bool local_21;
  ImGuiWindow *local_20;
  byte local_11;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  force_reinit = (undefined1)((uint)in_stack_ffffffffffffff7c >> 0x18);
  local_8 = GImGui;
  local_10 = (ImGuiWindow *)0x0;
  local_11 = 0;
  local_20 = GetFrontMostPopupModal();
  if (local_20 != (ImGuiWindow *)0x0) {
    local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
    return;
  }
  if ((local_8->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (local_8->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar5 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->NavWindowingHighlightAlpha,0.0);
    local_8->NavWindowingHighlightAlpha = fVar5;
    if ((local_8->DimBgRatio <= 0.0) && (local_8->NavWindowingHighlightAlpha <= 0.0)) {
      local_8->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  local_71 = false;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_71 = IsNavInputPressed(0,0x15542c);
  }
  local_21 = local_71;
  local_72 = false;
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) &&
     (local_72 = false, ((local_8->IO).KeyCtrl & 1U) != 0)) {
    bVar1 = IsKeyPressedMap(in_stack_ffffffffffffff64,
                            SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
    local_72 = false;
    if (bVar1) {
      local_72 = ((local_8->IO).ConfigFlags & 1U) != 0;
    }
  }
  local_22 = local_72;
  if (((local_21 & 1U) != 0) || (local_72 != false)) {
    if (local_8->NavWindow == (ImGuiWindow *)0x0) {
      in_stack_ffffffffffffff80 =
           FindWindowNavFocusable
                     (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64)
      ;
    }
    else {
      in_stack_ffffffffffffff80 = local_8->NavWindow;
    }
    local_30 = in_stack_ffffffffffffff80;
    if (in_stack_ffffffffffffff80 != (ImGuiWindow *)0x0) {
      local_8->NavWindowingTargetAnim = in_stack_ffffffffffffff80;
      local_8->NavWindowingTarget = in_stack_ffffffffffffff80;
      local_8->NavWindowingHighlightAlpha = 0.0;
      local_8->NavWindowingTimer = 0.0;
      local_8->NavWindowingToggleLayer = (bool)((local_22 & 1U) - 1 & 1);
      IVar4 = ImGuiInputSource_NavGamepad;
      if ((local_22 & 1U) != 0) {
        IVar4 = ImGuiInputSource_NavKeyboard;
      }
      local_8->NavInputSource = IVar4;
    }
  }
  local_8->NavWindowingTimer = (local_8->IO).DeltaTime + local_8->NavWindowingTimer;
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (local_8->NavInputSource == ImGuiInputSource_NavGamepad)) {
    fVar5 = local_8->NavWindowingHighlightAlpha;
    fVar6 = ImSaturate((local_8->NavWindowingTimer - 0.2) / 0.05);
    fVar5 = ImMax<float>(fVar5,fVar6);
    local_8->NavWindowingHighlightAlpha = fVar5;
    bVar1 = IsNavInputPressed(0,0x155672);
    uVar3 = (uint)bVar1;
    bVar1 = IsNavInputPressed(0,0x15568a);
    local_34 = uVar3 - bVar1;
    if (local_34 != 0) {
      NavUpdateWindowingHighlightWindow(in_stack_ffffffffffffff74);
      local_8->NavWindowingHighlightAlpha = 1.0;
    }
    force_reinit = (undefined1)(uVar3 >> 0x18);
    bVar1 = IsNavInputDown(3);
    if (!bVar1) {
      local_8->NavWindowingToggleLayer =
           (local_8->NavWindowingToggleLayer & 1U &
           (local_8->NavWindowingHighlightAlpha <= 1.0 && local_8->NavWindowingHighlightAlpha != 1.0
           )) != 0;
      if (((local_8->NavWindowingToggleLayer & 1U) == 0) ||
         (local_8->NavWindow == (ImGuiWindow *)0x0)) {
        if ((local_8->NavWindowingToggleLayer & 1U) == 0) {
          local_10 = local_8->NavWindowingTarget;
        }
      }
      else {
        local_11 = 1;
      }
      local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (local_8->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar5 = local_8->NavWindowingHighlightAlpha;
    fVar6 = ImSaturate((local_8->NavWindowingTimer - 0.2) / 0.05);
    fVar6 = ImMax<float>(fVar5,fVar6);
    local_8->NavWindowingHighlightAlpha = fVar6;
    bVar1 = IsKeyPressedMap(in_stack_ffffffffffffff64,
                            SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
    if (bVar1) {
      NavUpdateWindowingHighlightWindow((int)fVar5);
    }
    if (((local_8->IO).KeyCtrl & 1U) == 0) {
      local_10 = local_8->NavWindowingTarget;
    }
  }
  if (((local_8->ActiveId == 0) || ((local_8->ActiveIdAllowOverlap & 1U) != 0)) &&
     (bVar1 = IsNavInputPressed(0,0x1558a2), bVar1)) {
    bVar1 = IsMousePosValid(&(local_8->IO).MousePos);
    bVar2 = IsMousePosValid(&(local_8->IO).MousePosPrev);
    if (bVar1 == bVar2) {
      local_11 = 1;
    }
  }
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((local_8->NavWindowingTarget->Flags & 4U) == 0)) {
    ImVec2::ImVec2(&local_3c);
    if ((local_8->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((local_8->IO).KeyShift & 1U) == 0)) {
      local_44 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)
                                     ((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     (ImGuiInputReadMode)in_stack_ffffffffffffff98,
                                     (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                     (float)in_stack_ffffffffffffff90);
      local_3c = local_44;
    }
    if (local_8->NavInputSource == ImGuiInputSource_NavGamepad) {
      local_4c = GetNavInputAmount2d((ImGuiNavDirSourceFlags)
                                     ((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     (ImGuiInputReadMode)in_stack_ffffffffffffff98,
                                     (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                     (float)in_stack_ffffffffffffff90);
      local_3c = local_4c;
    }
    if ((local_3c.x == 0.0) && (!NAN(local_3c.x))) {
      if ((local_3c.y == 0.0) && (!NAN(local_3c.y))) goto LAB_00155a88;
    }
    local_50 = 0x44480000;
    fVar6 = (local_8->IO).DeltaTime * 800.0;
    fVar5 = ImMin<float>((local_8->IO).DisplayFramebufferScale.x,
                         (local_8->IO).DisplayFramebufferScale.y);
    local_54 = ImFloor(fVar6 * fVar5);
    local_5c = operator*(in_stack_ffffffffffffff58,0.0);
    operator+=(&local_8->NavWindowingTarget->RootWindow->Pos,&local_5c);
    local_8->NavDisableMouseHover = true;
    MarkIniSettingsDirty(local_8->NavWindowingTarget);
  }
LAB_00155a88:
  if ((local_10 != (ImGuiWindow *)0x0) &&
     ((local_8->NavWindow == (ImGuiWindow *)0x0 || (local_10 != local_8->NavWindow->RootWindow)))) {
    local_8->NavDisableHighlight = false;
    local_8->NavDisableMouseHover = true;
    local_10 = NavRestoreLastChildNavWindow(local_10);
    ClosePopupsOverWindow(in_stack_ffffffffffffff80);
    FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (local_10->NavLastIds[0] == 0) {
      NavInitWindow(in_stack_ffffffffffffff80,(bool)force_reinit);
    }
    if ((local_10->DC).NavLayerActiveMask == 2) {
      local_8->NavLayer = ImGuiNavLayer_Menu;
    }
  }
  if (local_10 != (ImGuiWindow *)0x0) {
    local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((local_11 & 1) != 0) && (local_8->NavWindow != (ImGuiWindow *)0x0)) {
    pIVar8 = local_8->NavWindow;
    while( true ) {
      bVar1 = false;
      if ((((pIVar8->DC).NavLayerActiveMask & 2U) == 0) &&
         (bVar1 = false, (pIVar8->Flags & 0x1000000U) != 0)) {
        bVar1 = (pIVar8->Flags & 0x14000000U) == 0;
      }
      if (!bVar1) break;
      pIVar8 = pIVar8->ParentWindow;
    }
    if (pIVar8 != local_8->NavWindow) {
      pIVar7 = local_8->NavWindow;
      FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pIVar8->NavLastChildNavWindow = pIVar7;
    }
    local_8->NavDisableHighlight = false;
    local_8->NavDisableMouseHover = true;
    if (((local_8->NavWindow->DC).NavLayerActiveMask & 2U) == 0) {
      layer = ImGuiNavLayer_Main;
    }
    else {
      layer = local_8->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
  }
  return;
}

Assistant:

static void ImGui::NavUpdateWindowing()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* apply_focus_window = NULL;
    bool apply_toggle_layer = false;

    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window != NULL)
    {
        g.NavWindowingTarget = NULL;
        return;
    }

    // Fade out
    if (g.NavWindowingTargetAnim && g.NavWindowingTarget == NULL)
    {
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha - g.IO.DeltaTime * 10.0f, 0.0f);
        if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
            g.NavWindowingTargetAnim = NULL;
    }

    // Start CTRL-TAB or Square+L/R window selection
    bool start_windowing_with_gamepad = !g.NavWindowingTarget && IsNavInputPressed(ImGuiNavInput_Menu, ImGuiInputReadMode_Pressed);
    bool start_windowing_with_keyboard = !g.NavWindowingTarget && g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab) && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard);
    if (start_windowing_with_gamepad || start_windowing_with_keyboard)
        if (ImGuiWindow* window = g.NavWindow ? g.NavWindow : FindWindowNavFocusable(g.WindowsFocusOrder.Size - 1, -INT_MAX, -1))
        {
            g.NavWindowingTarget = g.NavWindowingTargetAnim = window;
            g.NavWindowingTimer = g.NavWindowingHighlightAlpha = 0.0f;
            g.NavWindowingToggleLayer = start_windowing_with_keyboard ? false : true;
            g.NavInputSource = start_windowing_with_keyboard ? ImGuiInputSource_NavKeyboard : ImGuiInputSource_NavGamepad;
        }

    // Gamepad update
    g.NavWindowingTimer += g.IO.DeltaTime;
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavGamepad)
    {
        // Highlight only appears after a brief time holding the button, so that a fast tap on PadMenu (to toggle NavLayer) doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f));

        // Select window to focus
        const int focus_change_dir = (int)IsNavInputPressed(ImGuiNavInput_FocusPrev, ImGuiInputReadMode_RepeatSlow) - (int)IsNavInputPressed(ImGuiNavInput_FocusNext, ImGuiInputReadMode_RepeatSlow);
        if (focus_change_dir != 0)
        {
            NavUpdateWindowingHighlightWindow(focus_change_dir);
            g.NavWindowingHighlightAlpha = 1.0f;
        }

        // Single press toggles NavLayer, long press with L/R apply actual focus on release (until then the window was merely rendered front-most)
        if (!IsNavInputDown(ImGuiNavInput_Menu))
        {
            g.NavWindowingToggleLayer &= (g.NavWindowingHighlightAlpha < 1.0f); // Once button was held long enough we don't consider it a tap-to-toggle-layer press anymore.
            if (g.NavWindowingToggleLayer && g.NavWindow)
                apply_toggle_layer = true;
            else if (!g.NavWindowingToggleLayer)
                apply_focus_window = g.NavWindowingTarget;
            g.NavWindowingTarget = NULL;
        }
    }

    // Keyboard: Focus
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavKeyboard)
    {
        // Visuals only appears after a brief time after pressing TAB the first time, so that a fast CTRL+TAB doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f)); // 1.0f
        if (IsKeyPressedMap(ImGuiKey_Tab, true))
            NavUpdateWindowingHighlightWindow(g.IO.KeyShift ? +1 : -1);
        if (!g.IO.KeyCtrl)
            apply_focus_window = g.NavWindowingTarget;
    }

    // Keyboard: Press and Release ALT to toggle menu layer
    // FIXME: We lack an explicit IO variable for "is the imgui window focused", so compare mouse validity to detect the common case of back-end clearing releases all keys on ALT-TAB
    if ((g.ActiveId == 0 || g.ActiveIdAllowOverlap) && IsNavInputPressed(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Released))
        if (IsMousePosValid(&g.IO.MousePos) == IsMousePosValid(&g.IO.MousePosPrev))
            apply_toggle_layer = true;

    // Move window
    if (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoMove))
    {
        ImVec2 move_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && !g.IO.KeyShift)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down);
        if (move_delta.x != 0.0f || move_delta.y != 0.0f)
        {
            const float NAV_MOVE_SPEED = 800.0f;
            const float move_speed = ImFloor(NAV_MOVE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y)); // FIXME: Doesn't code variable framerate very well
            g.NavWindowingTarget->RootWindow->Pos += move_delta * move_speed;
            g.NavDisableMouseHover = true;
            MarkIniSettingsDirty(g.NavWindowingTarget);
        }
    }

    // Apply final focus
    if (apply_focus_window && (g.NavWindow == NULL || apply_focus_window != g.NavWindow->RootWindow))
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        apply_focus_window = NavRestoreLastChildNavWindow(apply_focus_window);
        ClosePopupsOverWindow(apply_focus_window);
        FocusWindow(apply_focus_window);
        if (apply_focus_window->NavLastIds[0] == 0)
            NavInitWindow(apply_focus_window, false);

        // If the window only has a menu layer, select it directly
        if (apply_focus_window->DC.NavLayerActiveMask == (1 << ImGuiNavLayer_Menu))
            g.NavLayer = ImGuiNavLayer_Menu;
    }
    if (apply_focus_window)
        g.NavWindowingTarget = NULL;

    // Apply menu/layer toggle
    if (apply_toggle_layer && g.NavWindow)
    {
        // Move to parent menu if necessary
        ImGuiWindow* new_nav_window = g.NavWindow;
        while ((new_nav_window->DC.NavLayerActiveMask & (1 << 1)) == 0 
            && (new_nav_window->Flags & ImGuiWindowFlags_ChildWindow) != 0
            && (new_nav_window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
            new_nav_window = new_nav_window->ParentWindow;
        if (new_nav_window != g.NavWindow)
        {
            ImGuiWindow* old_nav_window = g.NavWindow;
            FocusWindow(new_nav_window);
            new_nav_window->NavLastChildNavWindow = old_nav_window;
        }
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        NavRestoreLayer((g.NavWindow->DC.NavLayerActiveMask & (1 << ImGuiNavLayer_Menu)) ? (ImGuiNavLayer)((int)g.NavLayer ^ 1) : ImGuiNavLayer_Main);
    }
}